

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall Display::startWindow(Display *this)

{
  element_type *peVar1;
  runtime_error *this_00;
  
  peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OMG io is NULL");
  }
  else {
    (*peVar1->_vptr_IODevice[0xc])();
    peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"OMG io is NULL");
    }
    else {
      (*peVar1->_vptr_IODevice[0xe])(peVar1,0);
      (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IODevice
        [0xf])();
      peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"OMG io is NULL");
      }
      else {
        (*peVar1->_vptr_IODevice[0x10])();
        if ((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          checkWindowSize(this);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,0,7,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,1,4,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,2,2,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,3,1,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,4,6,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,5,1,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,6,6,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,7,5,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,8,6,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,10,7,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,0xb,7,1);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,0xc,3,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x11])(peVar1,0xd,2,0);
          peVar1 = (this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_IODevice[0x12])(peVar1,10);
          return;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"OMG io is NULL");
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Display::startWindow() {
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->initWindow();
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->setEcho(false);
    io->startColor();
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->startSpecialKeys();

    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    checkWindowSize();

    io->addColor(0, COLOR_WHITE, COLOR_BLACK);
    io->addColor(1, COLOR_BLUE, COLOR_BLACK);
    io->addColor(2, COLOR_GREEN, COLOR_BLACK);
    io->addColor(3, COLOR_RED, COLOR_BLACK);
    io->addColor(4, COLOR_CYAN, COLOR_BLACK);
    io->addColor(5, COLOR_RED, COLOR_BLACK);
    io->addColor(6, COLOR_CYAN, COLOR_BLACK);
    io->addColor(7, COLOR_MAGENTA, COLOR_BLACK);
    io->addColor(8, COLOR_CYAN, COLOR_BLACK);
    io->addColor(10, COLOR_WHITE, COLOR_BLACK);
    io->addColor(11, COLOR_WHITE, COLOR_RED);
    io->addColor(12, COLOR_YELLOW, COLOR_BLACK);
    io->addColor(13, COLOR_GREEN, COLOR_BLACK);

    io->setBackground(10);
}